

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O1

void __thiscall cbtGImpactMeshShape::calcLocalAABB(cbtGImpactMeshShape *this)

{
  cbtAABB *pcVar1;
  cbtVector3 *pcVar2;
  float fVar3;
  cbtGImpactMeshShapePart *pcVar4;
  undefined1 auVar5 [16];
  cbtAABB *pcVar6;
  cbtVector3 *pcVar7;
  cbtAABB *pcVar8;
  cbtVector3 *pcVar9;
  long lVar10;
  
  (this->super_cbtGImpactShapeInterface).m_localAABB.m_min.m_floats[0] = 3.4028235e+38;
  (this->super_cbtGImpactShapeInterface).m_localAABB.m_min.m_floats[1] = 3.4028235e+38;
  (this->super_cbtGImpactShapeInterface).m_localAABB.m_min.m_floats[2] = 3.4028235e+38;
  (this->super_cbtGImpactShapeInterface).m_localAABB.m_max.m_floats[0] = -3.4028235e+38;
  (this->super_cbtGImpactShapeInterface).m_localAABB.m_max.m_floats[1] = -3.4028235e+38;
  (this->super_cbtGImpactShapeInterface).m_localAABB.m_max.m_floats[2] = -3.4028235e+38;
  lVar10 = (long)(this->m_mesh_parts).m_size;
  if (lVar10 != 0) {
    pcVar1 = &(this->super_cbtGImpactShapeInterface).m_localAABB;
    pcVar2 = &(this->super_cbtGImpactShapeInterface).m_localAABB.m_max;
    do {
      pcVar4 = (this->m_mesh_parts).m_data[lVar10 + -1];
      if ((pcVar4->super_cbtGImpactShapeInterface).m_needs_update == true) {
        (*(pcVar4->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
          _vptr_cbtCollisionShape[0x11])(pcVar4);
        (pcVar4->super_cbtGImpactShapeInterface).m_needs_update = false;
      }
      pcVar4 = (this->m_mesh_parts).m_data[lVar10 + -1];
      pcVar6 = &(pcVar4->super_cbtGImpactShapeInterface).m_localAABB;
      auVar5 = vminss_avx(ZEXT416((uint)(pcVar4->super_cbtGImpactShapeInterface).m_localAABB.m_min.
                                        m_floats[0]),
                          ZEXT416((uint)(this->super_cbtGImpactShapeInterface).m_localAABB.m_min.
                                        m_floats[0]));
      (this->super_cbtGImpactShapeInterface).m_localAABB.m_min.m_floats[0] = auVar5._0_4_;
      fVar3 = (this->super_cbtGImpactShapeInterface).m_localAABB.m_min.m_floats[2];
      pcVar8 = pcVar6;
      if ((this->super_cbtGImpactShapeInterface).m_localAABB.m_min.m_floats[1] <=
          (pcVar4->super_cbtGImpactShapeInterface).m_localAABB.m_min.m_floats[1]) {
        pcVar8 = pcVar1;
      }
      (this->super_cbtGImpactShapeInterface).m_localAABB.m_min.m_floats[1] =
           (pcVar8->m_min).m_floats[1];
      if (fVar3 <= (pcVar4->super_cbtGImpactShapeInterface).m_localAABB.m_min.m_floats[2]) {
        pcVar6 = pcVar1;
      }
      (this->super_cbtGImpactShapeInterface).m_localAABB.m_min.m_floats[2] =
           (pcVar6->m_min).m_floats[2];
      pcVar7 = &(pcVar4->super_cbtGImpactShapeInterface).m_localAABB.m_max;
      auVar5 = vmaxss_avx(ZEXT416((uint)(pcVar4->super_cbtGImpactShapeInterface).m_localAABB.m_max.
                                        m_floats[0]),
                          ZEXT416((uint)(this->super_cbtGImpactShapeInterface).m_localAABB.m_max.
                                        m_floats[0]));
      (this->super_cbtGImpactShapeInterface).m_localAABB.m_max.m_floats[0] = auVar5._0_4_;
      pcVar9 = pcVar7;
      if ((pcVar4->super_cbtGImpactShapeInterface).m_localAABB.m_max.m_floats[1] <=
          (this->super_cbtGImpactShapeInterface).m_localAABB.m_max.m_floats[1]) {
        pcVar9 = pcVar2;
      }
      (this->super_cbtGImpactShapeInterface).m_localAABB.m_max.m_floats[1] = pcVar9->m_floats[1];
      if ((pcVar4->super_cbtGImpactShapeInterface).m_localAABB.m_max.m_floats[2] <=
          (this->super_cbtGImpactShapeInterface).m_localAABB.m_max.m_floats[2]) {
        pcVar7 = pcVar2;
      }
      lVar10 = lVar10 + -1;
      (this->super_cbtGImpactShapeInterface).m_localAABB.m_max.m_floats[2] = pcVar7->m_floats[2];
    } while (lVar10 != 0);
  }
  return;
}

Assistant:

virtual void calcLocalAABB()
	{
		m_localAABB.invalidate();
		int i = m_mesh_parts.size();
		while (i--)
		{
			m_mesh_parts[i]->updateBound();
			m_localAABB.merge(m_mesh_parts[i]->getLocalBox());
		}
	}